

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::AddRequiredTargetCxxFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  char *pcVar1;
  char **ppcVar2;
  char **ppcVar3;
  ostream *poVar4;
  string *psVar5;
  cmake *this_00;
  char **ppcVar6;
  bool bVar7;
  byte local_52c;
  byte local_52b;
  byte local_52a;
  byte local_529;
  char **local_518;
  allocator local_459;
  string local_458;
  allocator local_431;
  string local_430;
  allocator local_409;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  allocator local_391;
  string local_390;
  allocator local_369;
  string local_368;
  allocator local_341;
  string local_340;
  byte local_319;
  cmStrCmp local_318;
  byte local_2f1;
  cmStrCmp local_2f0;
  byte local_2c9;
  cmStrCmp local_2c8;
  byte local_2a1;
  cmStrCmp local_2a0;
  byte local_27d;
  byte local_27c;
  byte local_27b;
  byte local_27a;
  byte local_279;
  undefined1 local_278 [3];
  bool setCxx17;
  bool setCxx14;
  bool setCxx11;
  bool setCxx98;
  char **local_258;
  char **existingCxxIt;
  string local_230 [32];
  ostringstream local_210 [8];
  ostringstream e;
  cmStrCmp local_98;
  allocator local_61;
  string local_60;
  char *local_40;
  char *existingCxxStandard;
  bool needCxx17;
  bool needCxx14;
  bool needCxx11;
  string *psStack_30;
  bool needCxx98;
  string *error_local;
  string *feature_local;
  cmTarget *target_local;
  cmMakefile *this_local;
  
  existingCxxStandard._7_1_ = 0;
  existingCxxStandard._6_1_ = 0;
  existingCxxStandard._5_1_ = 0;
  existingCxxStandard._4_1_ = 0;
  psStack_30 = error;
  error_local = feature;
  feature_local = (string *)target;
  target_local = (cmTarget *)this;
  CheckNeededCxxLanguage
            (this,feature,(bool *)((long)&existingCxxStandard + 7),
             (bool *)((long)&existingCxxStandard + 6),(bool *)((long)&existingCxxStandard + 5),
             (bool *)((long)&existingCxxStandard + 4));
  psVar5 = feature_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"CXX_STANDARD",&local_61);
  pcVar1 = cmTarget::GetProperty((cmTarget *)psVar5,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_40 = pcVar1;
  if (pcVar1 != (char *)0x0) {
    ppcVar2 = cmArrayBegin<char_const*,4ul>(&CXX_STANDARDS);
    ppcVar3 = cmArrayEnd<char_const*,4ul>(&CXX_STANDARDS);
    cmStrCmp::cmStrCmp(&local_98,local_40);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_98);
    ppcVar3 = cmArrayEnd<char_const*,4ul>(&CXX_STANDARDS);
    cmStrCmp::~cmStrCmp(&local_98);
    if (ppcVar2 == ppcVar3) {
      std::__cxx11::ostringstream::ostringstream(local_210);
      poVar4 = std::operator<<((ostream *)local_210,"The CXX_STANDARD property on target \"");
      psVar5 = cmTarget::GetName_abi_cxx11_((cmTarget *)feature_local);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"\" contained an invalid value: \"");
      poVar4 = std::operator<<(poVar4,local_40);
      std::operator<<(poVar4,"\".");
      if (psStack_30 == (string *)0x0) {
        this_00 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        cmake::IssueMessage(this_00,FATAL_ERROR,(string *)&existingCxxIt,&this->Backtrace);
        std::__cxx11::string::~string((string *)&existingCxxIt);
      }
      else {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)psStack_30,local_230);
        std::__cxx11::string::~string(local_230);
      }
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_210);
      goto LAB_00510517;
    }
  }
  local_279 = 0;
  if (local_40 == (char *)0x0) {
    local_518 = cmArrayEnd<char_const*,4ul>(&CXX_STANDARDS);
  }
  else {
    ppcVar2 = cmArrayBegin<char_const*,4ul>(&CXX_STANDARDS);
    ppcVar3 = cmArrayEnd<char_const*,4ul>(&CXX_STANDARDS);
    cmStrCmp::cmStrCmp((cmStrCmp *)local_278,local_40);
    local_279 = 1;
    local_518 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,(cmStrCmp *)local_278);
  }
  if ((local_279 & 1) != 0) {
    cmStrCmp::~cmStrCmp((cmStrCmp *)local_278);
  }
  local_258 = local_518;
  local_529 = 0;
  if ((existingCxxStandard._7_1_ & 1) != 0) {
    local_529 = local_40 != (char *)0x0 ^ 0xff;
  }
  local_27a = local_529 & 1;
  local_52a = 0;
  if ((existingCxxStandard._6_1_ & 1) != 0) {
    local_52a = local_40 != (char *)0x0 ^ 0xff;
  }
  local_27b = local_52a & 1;
  local_52b = 0;
  if ((existingCxxStandard._5_1_ & 1) != 0) {
    local_52b = local_40 != (char *)0x0 ^ 0xff;
  }
  local_27c = local_52b & 1;
  local_52c = 0;
  if ((existingCxxStandard._4_1_ & 1) != 0) {
    local_52c = local_40 != (char *)0x0 ^ 0xff;
  }
  local_27d = local_52c & 1;
  local_2a1 = 0;
  bVar7 = false;
  if (((existingCxxStandard._4_1_ & 1) != 0) && (bVar7 = false, local_40 != (char *)0x0)) {
    ppcVar2 = cmArrayBegin<char_const*,4ul>(&CXX_STANDARDS);
    ppcVar3 = cmArrayEnd<char_const*,4ul>(&CXX_STANDARDS);
    cmStrCmp::cmStrCmp(&local_2a0,"17");
    local_2a1 = 1;
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_2a0);
    bVar7 = local_518 < ppcVar2;
  }
  if ((local_2a1 & 1) != 0) {
    cmStrCmp::~cmStrCmp(&local_2a0);
  }
  ppcVar2 = local_258;
  if (bVar7) {
    local_27d = 1;
  }
  else {
    local_2c9 = 0;
    bVar7 = false;
    if (((existingCxxStandard._5_1_ & 1) != 0) && (bVar7 = false, local_40 != (char *)0x0)) {
      ppcVar3 = cmArrayBegin<char_const*,4ul>(&CXX_STANDARDS);
      ppcVar6 = cmArrayEnd<char_const*,4ul>(&CXX_STANDARDS);
      cmStrCmp::cmStrCmp(&local_2c8,"14");
      local_2c9 = 1;
      ppcVar3 = std::find_if<char_const*const*,cmStrCmp>(ppcVar3,ppcVar6,&local_2c8);
      bVar7 = ppcVar2 < ppcVar3;
    }
    if ((local_2c9 & 1) != 0) {
      cmStrCmp::~cmStrCmp(&local_2c8);
    }
    ppcVar2 = local_258;
    if (bVar7) {
      local_27c = 1;
    }
    else {
      local_2f1 = 0;
      bVar7 = false;
      if (((existingCxxStandard._6_1_ & 1) != 0) && (bVar7 = false, local_40 != (char *)0x0)) {
        ppcVar3 = cmArrayBegin<char_const*,4ul>(&CXX_STANDARDS);
        ppcVar6 = cmArrayEnd<char_const*,4ul>(&CXX_STANDARDS);
        cmStrCmp::cmStrCmp(&local_2f0,"11");
        local_2f1 = 1;
        ppcVar3 = std::find_if<char_const*const*,cmStrCmp>(ppcVar3,ppcVar6,&local_2f0);
        bVar7 = ppcVar2 < ppcVar3;
      }
      if ((local_2f1 & 1) != 0) {
        cmStrCmp::~cmStrCmp(&local_2f0);
      }
      ppcVar2 = local_258;
      if (bVar7) {
        local_27b = 1;
      }
      else {
        local_319 = 0;
        bVar7 = false;
        if (((existingCxxStandard._7_1_ & 1) != 0) && (bVar7 = false, local_40 != (char *)0x0)) {
          ppcVar3 = cmArrayBegin<char_const*,4ul>(&CXX_STANDARDS);
          ppcVar6 = cmArrayEnd<char_const*,4ul>(&CXX_STANDARDS);
          cmStrCmp::cmStrCmp(&local_318,"98");
          local_319 = 1;
          ppcVar3 = std::find_if<char_const*const*,cmStrCmp>(ppcVar3,ppcVar6,&local_318);
          bVar7 = ppcVar2 < ppcVar3;
        }
        if ((local_319 & 1) != 0) {
          cmStrCmp::~cmStrCmp(&local_318);
        }
        if (bVar7) {
          local_27a = 1;
        }
      }
    }
  }
  psVar5 = feature_local;
  if ((local_27d & 1) == 0) {
    if ((local_27c & 1) == 0) {
      if ((local_27b & 1) == 0) {
        if ((local_27a & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_430,"CXX_STANDARD",&local_431);
          cmTarget::SetProperty((cmTarget *)psVar5,&local_430,"98");
          std::__cxx11::string::~string((string *)&local_430);
          std::allocator<char>::~allocator((allocator<char> *)&local_431);
          psVar5 = feature_local;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_458,"CUDA_STANDARD",&local_459);
          cmTarget::SetProperty((cmTarget *)psVar5,&local_458,"98");
          std::__cxx11::string::~string((string *)&local_458);
          std::allocator<char>::~allocator((allocator<char> *)&local_459);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3e0,"CXX_STANDARD",&local_3e1);
        cmTarget::SetProperty((cmTarget *)psVar5,&local_3e0,"11");
        std::__cxx11::string::~string((string *)&local_3e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
        psVar5 = feature_local;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_408,"CUDA_STANDARD",&local_409);
        cmTarget::SetProperty((cmTarget *)psVar5,&local_408,"11");
        std::__cxx11::string::~string((string *)&local_408);
        std::allocator<char>::~allocator((allocator<char> *)&local_409);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_390,"CXX_STANDARD",&local_391);
      cmTarget::SetProperty((cmTarget *)psVar5,&local_390,"14");
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
      psVar5 = feature_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3b8,"CUDA_STANDARD",&local_3b9);
      cmTarget::SetProperty((cmTarget *)psVar5,&local_3b8,"14");
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_340,"CXX_STANDARD",&local_341);
    cmTarget::SetProperty((cmTarget *)psVar5,&local_340,"17");
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
    psVar5 = feature_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_368,"CUDA_STANDARD",&local_369);
    cmTarget::SetProperty((cmTarget *)psVar5,&local_368,"17");
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
  }
  this_local._7_1_ = 1;
LAB_00510517:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::AddRequiredTargetCxxFeature(cmTarget* target,
                                             const std::string& feature,
                                             std::string* error) const
{
  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;
  bool needCxx17 = false;

  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14,
                               needCxx17);

  const char* existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (existingCxxStandard) {
    if (std::find_if(cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS),
                     cmStrCmp(existingCxxStandard)) ==
        cmArrayEnd(CXX_STANDARDS)) {
      std::ostringstream e;
      e << "The CXX_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                               this->Backtrace);
      }
      return false;
    }
  }
  const char* const* existingCxxIt = existingCxxStandard
    ? std::find_if(cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS),
                   cmStrCmp(existingCxxStandard))
    : cmArrayEnd(CXX_STANDARDS);

  bool setCxx98 = needCxx98 && !existingCxxStandard;
  bool setCxx11 = needCxx11 && !existingCxxStandard;
  bool setCxx14 = needCxx14 && !existingCxxStandard;
  bool setCxx17 = needCxx17 && !existingCxxStandard;

  if (needCxx17 && existingCxxStandard &&
      existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                   cmArrayEnd(CXX_STANDARDS),
                                   cmStrCmp("17"))) {
    setCxx17 = true;
  } else if (needCxx14 && existingCxxStandard &&
             existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                          cmArrayEnd(CXX_STANDARDS),
                                          cmStrCmp("14"))) {
    setCxx14 = true;
  } else if (needCxx11 && existingCxxStandard &&
             existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                          cmArrayEnd(CXX_STANDARDS),
                                          cmStrCmp("11"))) {
    setCxx11 = true;
  } else if (needCxx98 && existingCxxStandard &&
             existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                          cmArrayEnd(CXX_STANDARDS),
                                          cmStrCmp("98"))) {
    setCxx98 = true;
  }

  if (setCxx17) {
    target->SetProperty("CXX_STANDARD", "17");
    target->SetProperty("CUDA_STANDARD", "17");
  } else if (setCxx14) {
    target->SetProperty("CXX_STANDARD", "14");
    target->SetProperty("CUDA_STANDARD", "14");
  } else if (setCxx11) {
    target->SetProperty("CXX_STANDARD", "11");
    target->SetProperty("CUDA_STANDARD", "11");
  } else if (setCxx98) {
    target->SetProperty("CXX_STANDARD", "98");
    target->SetProperty("CUDA_STANDARD", "98");
  }
  return true;
}